

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZChunkVector.h
# Opt level: O1

void __thiscall
TPZChunkVector<TPZGraphEl_*,_10>::Write
          (TPZChunkVector<TPZGraphEl_*,_10> *this,TPZStream *buf,int withclassid)

{
  TPZGraphEl **ppTVar1;
  ulong nelem;
  uint64_t nObjects;
  ulong local_20;
  
  local_20 = this->fNElements;
  (*buf->_vptr_TPZStream[6])(buf,&local_20,1);
  if (local_20 != 0) {
    nelem = 0;
    do {
      ppTVar1 = operator[](this,nelem);
      TPZPersistenceManager::WritePointer(&(*ppTVar1)->super_TPZSavable,buf);
      nelem = nelem + 1;
    } while (nelem < local_20);
  }
  return;
}

Assistant:

void Write(TPZStream& buf, int withclassid) const override{
        uint64_t nObjects = this->NElements();
        buf.Write(&nObjects);
        for (uint64_t i = 0; i < nObjects; i++) {
            WriteInternal(this->operator [](i), buf, withclassid);
        }
    }